

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O2

uint64_t uniform_hash(void *key,size_t len,uint64_t seed)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  byte *pbVar6;
  uint uVar7;
  uint8_t *data;
  
  uVar4 = (uint)len;
  iVar1 = (int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | len & 0xffffffff) / 4);
  pbVar6 = (byte *)((long)(iVar1 * 4) + (long)key);
  for (lVar5 = (long)-iVar1; uVar7 = (uint)seed, lVar5 != 0; lVar5 = lVar5 + 1) {
    uVar7 = ((uint)(*(int *)(pbVar6 + lVar5 * 4) * -0x3361d2af) >> 0x11 |
            *(int *)(pbVar6 + lVar5 * 4) * 0x16a88000) * 0x1b873593 ^ uVar7;
    seed = (uint64_t)((uVar7 << 0xd | uVar7 >> 0x13) * 5 + 0xe6546b64);
  }
  uVar3 = 0;
  uVar2 = 0;
  switch(uVar4 & 3) {
  case 3:
    uVar2 = (uint)pbVar6[2] << 0x10;
  case 2:
    uVar3 = uVar2 | (uint)pbVar6[1] << 8;
  case 1:
    uVar7 = uVar7 ^ ((*pbVar6 ^ uVar3) * -0x3361d2af >> 0x11 | (*pbVar6 ^ uVar3) * 0x16a88000) *
                    0x1b873593;
  case 0:
    uVar4 = ((uVar7 ^ uVar4) >> 0x10 ^ uVar7 ^ uVar4) * -0x7a143595;
    uVar4 = (uVar4 >> 0xd ^ uVar4) * -0x3d4d51cb;
    return (ulong)(uVar4 >> 0x10 ^ uVar4);
  }
}

Assistant:

inline uint64_t uniform_hash(const void * key, size_t len, uint64_t seed)
{
  const uint8_t * data = (const uint8_t*)key;
  const int nblocks = (int)len / 4;

  uint32_t h1 = (uint32_t)seed;

  const uint32_t c1 = 0xcc9e2d51;
  const uint32_t c2 = 0x1b873593;

  // --- body
  const uint32_t * blocks = (const uint32_t *)(data + nblocks * 4);

  for (int i = -nblocks; i; i++)
  {
    uint32_t k1 = MURMUR_HASH_3::getblock(blocks, i);

    k1 *= c1;
    k1 = ROTL32(k1, 15);
    k1 *= c2;

    h1 ^= k1;
    h1 = ROTL32(h1, 13);
    h1 = h1 * 5 + 0xe6546b64;
  }

  // --- tail
  const uint8_t * tail = (const uint8_t*)(data + nblocks * 4);

  uint32_t k1 = 0;

  switch (len & 3)
  {
  case 3: k1 ^= tail[2] << 16;
  case 2: k1 ^= tail[1] << 8;
  case 1: k1 ^= tail[0];
    k1 *= c1; k1 = ROTL32(k1, 15); k1 *= c2; h1 ^= k1;
  }

  // --- finalization
  h1 ^= len;

  return MURMUR_HASH_3::fmix(h1);
}